

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

void __thiscall urllib::Response::parseRespone(Response *this)

{
  allocator<char> *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  string *this_00;
  size_type pos2;
  size_type pos1;
  difference_type in_stack_ffffffffffffff00;
  string *this_01;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  allocator<char> local_c1;
  undefined8 local_c0;
  undefined8 local_b8;
  char *local_b0;
  char *local_a8;
  string local_a0 [55];
  allocator<char> local_69;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  string local_38 [32];
  undefined8 local_18;
  undefined8 local_10;
  
  __end._M_current = (char *)(in_RDI + 0x40);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_10 = std::__cxx11::string::find(__end._M_current,0x10e185);
  local_18 = std::__cxx11::string::find(__end._M_current,0x10e183);
  local_50 = std::__cxx11::string::begin();
  local_48 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_40 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_68 = std::__cxx11::string::begin();
  local_60 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_58 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  __beg._M_current = (char *)&local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (this_02,__beg,__end,in_RDI);
  this_01 = local_38;
  std::__cxx11::string::operator=((string *)in_RDI,this_01);
  std::__cxx11::string::~string(this_01);
  std::allocator<char>::~allocator(&local_69);
  this_00 = (string *)in_RDI + 0x40;
  local_b8 = std::__cxx11::string::begin();
  local_b0 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this_00,(difference_type)this_01);
  local_a8 = (char *)__gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)this_00,(difference_type)this_01);
  local_c0 = std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (this_02,__beg,__end,in_RDI);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void Response::parseRespone()
{
    auto pos1 = resp_.find("\r\n");   // ignore HTTP respone line
    auto pos2 = resp_.find("\r\n\r\n");
    headers_ = std::move(string(resp_.begin()+pos1+2, resp_.begin()+pos2+4));
    body_ = std::move(string(resp_.begin()+pos2+4,resp_.end()));
}